

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O3

DS_STATUS ds_list_insert(DsList *list,int index,void *data)

{
  ulong uVar1;
  ulong uVar2;
  DsListEntry *pDVar3;
  DsListEntry *pDVar4;
  DsListEntry *pDVar5;
  DsList *pDVar6;
  DsList *pDVar7;
  DsListEntry *pDVar8;
  int iVar9;
  ulong uVar10;
  
  if (list == (DsList *)0x0) {
    return DS_STATUS_NULL;
  }
  if (index < 0) {
    return DS_STATUS_OUTMEM;
  }
  uVar10 = (ulong)(uint)index;
  uVar2 = list->size;
  if (uVar2 < uVar10) {
    return DS_STATUS_OUTMEM;
  }
  pDVar4 = (DsListEntry *)malloc(0x18);
  if (pDVar4 == (DsListEntry *)0x0) {
    return DS_STATUS_OUTMEM;
  }
  pDVar4->data = data;
  pDVar4->next = (DsListEntry *)0x0;
  pDVar4->prev = (DsListEntry *)0x0;
  pDVar5 = list->entry;
  pDVar3 = pDVar5;
  pDVar6 = list;
  if (pDVar5 == (DsListEntry *)0x0) {
    pDVar7 = list;
    if (uVar2 != uVar10) goto LAB_00101269;
  }
  else {
    do {
      pDVar7 = pDVar6;
      pDVar8 = pDVar3;
      uVar1 = uVar10 - 1;
      if (pDVar8->next == (DsListEntry *)0x0) break;
      iVar9 = (int)uVar10;
      pDVar3 = pDVar8->next;
      pDVar6 = (DsList *)&pDVar8->next;
      uVar10 = uVar1;
    } while (iVar9 != 0);
    if (uVar2 - 1 != uVar1) {
      pDVar4->next = pDVar8;
      pDVar5 = pDVar8->prev;
      pDVar4->prev = pDVar5;
      pDVar6 = (DsList *)&pDVar5->next;
      if (pDVar5 == (DsListEntry *)0x0) {
        pDVar6 = pDVar7;
      }
      pDVar6->entry = pDVar4;
      pDVar6 = (DsList *)&pDVar8->prev;
LAB_00101269:
      pDVar6->entry = pDVar4;
      goto LAB_0010126c;
    }
    if (pDVar5 != (DsListEntry *)0x0) {
      do {
        pDVar5 = pDVar8;
        pDVar8 = pDVar5->next;
      } while (pDVar5->next != (DsListEntry *)0x0);
      pDVar5->next = pDVar4;
      pDVar4->next = (DsListEntry *)0x0;
      pDVar4->prev = pDVar5;
      goto LAB_0010126c;
    }
  }
  pDVar7->entry = pDVar4;
LAB_0010126c:
  list->size = uVar2 + 1;
  return DS_STATUS_OK;
}

Assistant:

DS_STATUS ds_list_insert(DsList *list, int index, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    if (index < 0 || index > list->size)
        return DS_STATUS_OUTMEM;

    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->next = NULL;
    in->prev = NULL;

    DS_STATUS status;

    // ! 这里需要获取list->entry的地址
    DsListEntry **entry = &list->entry;
    while ((*entry) && (*entry)->next && index > 0)
    {
        index--;
        // ! 需要改变的是entry的地址
        entry = &(*entry)->next;
    }

    if (index == list->size)
        status = ds_entry_append(entry, in);
    else
        status = ds_entry_prepend(entry, in);

    if (status != DS_STATUS_OK)
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}